

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O3

string * __thiscall
flatbuffers::kotlin::KotlinGenerator::GenTypePointer_abi_cxx11_
          (string *__return_storage_ptr__,KotlinGenerator *this,Type *type)

{
  BaseType BVar1;
  StructDef *def;
  char *pcVar2;
  char *pcVar3;
  _Alloc_hider local_48;
  StructDef *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_38;
  
  BVar1 = type->base_type;
  if (BVar1 == BASE_TYPE_STRUCT) {
    def = type->struct_def;
    local_48._M_p = (pointer)&aStack_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"");
    BaseGenerator::WrapInNameSpace
              (__return_storage_ptr__,&this->super_BaseGenerator,&def->super_Definition,
               (string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_p != &aStack_38) {
      operator_delete(local_48._M_p,(ulong)(aStack_38._M_allocated_capacity + 1));
    }
  }
  else if (BVar1 == BASE_TYPE_VECTOR) {
    aStack_38._8_2_ = type->fixed_length;
    local_48._M_p._4_4_ = 0;
    local_48._M_p._0_4_ = type->element;
    local_40 = type->struct_def;
    aStack_38._M_allocated_capacity = (size_type)type->enum_def;
    GenTypeGet_abi_cxx11_(__return_storage_ptr__,this,(Type *)&local_48);
  }
  else {
    if (BVar1 == BASE_TYPE_STRING) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "String";
      pcVar2 = "";
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "Table";
      pcVar2 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypePointer(const Type &type) const {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "String";
      case BASE_TYPE_VECTOR: return GenTypeGet(type.VectorType());
      case BASE_TYPE_STRUCT: return WrapInNameSpace(*type.struct_def);
      default: return "Table";
    }
  }